

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_block_decoder.c
# Opt level: O1

int pt_blk_proceed_to_disabled
              (pt_block_decoder *decoder,pt_block *block,pt_insn *insn,pt_insn_ext *iext,
              pt_event *ev)

{
  bool bVar1;
  anon_union_16_5_d9daf2ef_for_variant aVar2;
  int iVar3;
  int iVar4;
  pt_config *config;
  uint64_t ip;
  uint64_t local_40;
  pt_conf_addr_filter *local_38;
  
  iVar3 = -1;
  if (ev != (pt_event *)0x0) {
    if ((ev->field_0x4 & 1) == 0) {
      iVar3 = pt_blk_proceed_to_ip(decoder,block,insn,iext,(ev->variant).enabled.ip);
      return iVar3;
    }
    if (((decoder->evdec).pacdec.config.addr_filter.config.addr_cfg == 0) ||
       ((undefined1  [64])
        ((undefined1  [64])(decoder->evdec).pacdec.config.errata & (undefined1  [64])0x20) ==
        (undefined1  [64])0x0)) {
      if ((insn != (pt_insn *)0x0) &&
         (iVar3 = pt_blk_proceed_one_insn(decoder,block,insn,iext), 0 < iVar3)) {
        do {
          iVar3 = pt_insn_changes_cr3(insn,iext);
          if (iVar3 != 0) {
            return iVar3;
          }
          iVar3 = pt_insn_next_ip(&decoder->ip,insn,iext);
          if (iVar3 < 0) {
            return iVar3;
          }
          aVar2 = (decoder->flags).variant;
          if ((((undefined1  [16])((undefined1  [16])aVar2 & (undefined1  [16])0x1) !=
                (undefined1  [16])0x0) && (insn->iclass == ptic_call)) ||
             (((undefined1  [16])((undefined1  [16])aVar2 & (undefined1  [16])0x4) !=
               (undefined1  [16])0x0 && (insn->iclass == ptic_jump)))) {
            return 0;
          }
          iVar3 = pt_blk_proceed_one_insn(decoder,block,insn,iext);
        } while (0 < iVar3);
      }
    }
    else if (iext != (pt_insn_ext *)0x0 && insn != (pt_insn *)0x0) {
      local_38 = &(decoder->evdec).pacdec.config.addr_filter;
      do {
        iVar3 = pt_blk_proceed_to_insn(decoder,block,insn,iext,pt_insn_skl014);
        if (((iVar3 < 1) || (iVar4 = pt_insn_changes_cr3(insn,iext), iVar4 != 0)) ||
           (iVar3 = pt_insn_next_ip(&local_40,insn,iext), iVar3 < 0)) {
LAB_00111f92:
          bVar1 = false;
        }
        else {
          iVar3 = pt_filter_addr_check(local_38,local_40);
          if (iVar3 < 1) {
            iVar3 = iVar3 + (uint)(iVar3 == 0);
            goto LAB_00111f92;
          }
          decoder->ip = local_40;
          aVar2 = (decoder->flags).variant;
          if ((((undefined1  [16])((undefined1  [16])aVar2 & (undefined1  [16])0x1) !=
                (undefined1  [16])0x0) && (insn->iclass == ptic_call)) ||
             (((undefined1  [16])((undefined1  [16])aVar2 & (undefined1  [16])0x4) !=
               (undefined1  [16])0x0 && (insn->iclass == ptic_jump)))) goto LAB_00111f92;
          bVar1 = true;
        }
      } while (bVar1);
    }
  }
  return iVar3;
}

Assistant:

static int pt_blk_proceed_to_disabled(struct pt_block_decoder *decoder,
				      struct pt_block *block,
				      struct pt_insn *insn,
				      struct pt_insn_ext *iext,
				      const struct pt_event *ev)
{
	if (!decoder || !block || !ev)
		return -pte_internal;

	if (ev->ip_suppressed) {
		const struct pt_config *config;

		config = pt_blk_config(decoder);
		if (!config)
			return -pte_internal;

		/* Due to SKL014 the TIP.PGD payload may be suppressed also for
		 * direct branches.
		 *
		 * If we don't have a filter configuration we assume that no
		 * address filters were used and the erratum does not apply.
		 *
		 * We might otherwise disable tracing too early.
		 */
		if (config->addr_filter.config.addr_cfg &&
		    config->errata.skl014)
			return pt_blk_proceed_skl014(decoder, block, insn,
						     iext);

		/* A synchronous disabled event also binds to far branches and
		 * CPL-changing instructions.  Both would require trace,
		 * however, and are thus implicitly handled by erroring out.
		 *
		 * The would-require-trace error is handled by our caller.
		 */
		return pt_blk_proceed_to_insn(decoder, block, insn, iext,
					      pt_insn_changes_cr3);
	} else
		return pt_blk_proceed_to_ip(decoder, block, insn, iext,
					    ev->variant.disabled.ip);
}